

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeAttributeConnectivitiesOnFace
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner)

{
  pointer pAVar1;
  const_reference is_seam;
  uint uVar2;
  int c;
  long lVar3;
  ulong uVar4;
  reference rVar5;
  uint local_44 [3];
  vector<bool,_std::allocator<bool>_> *local_38;
  
  if (corner.value_ == 0xffffffff) {
    local_44[1] = 0xffffffff;
    local_44[2] = -1;
  }
  else {
    local_44[1] = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      local_44[1] = corner.value_ + 1;
    }
    if (corner.value_ % 3 == 0) {
      local_44[2] = corner.value_ + 2;
    }
    else {
      local_44[2] = corner.value_ - 1;
    }
  }
  lVar3 = 0;
  uVar4 = (ulong)corner.value_;
  if (corner.value_ != 0xffffffff) {
    uVar4 = (ulong)corner.value_ / 3;
  }
  local_38 = &this->visited_faces_;
  local_44[0] = corner.value_;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,uVar4);
  *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
  for (; lVar3 != 3; lVar3 = lVar3 + 1) {
    uVar4 = (ulong)local_44[lVar3];
    if ((uVar4 != 0xffffffff) &&
       (uVar2 = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                     _M_head_impl)->opposite_corners_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         + uVar4 * 4), uVar2 != 0xffffffff)) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,(ulong)uVar2 / 3);
      if ((*rVar5._M_p & rVar5._M_mask) == 0) {
        uVar2 = 0;
        while( true ) {
          pAVar1 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this->attribute_data_).
                             super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::AttributeData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x130) <=
              (ulong)uVar2) break;
          is_seam = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (&pAVar1[uVar2].connectivity_data.is_edge_on_seam_,uVar4);
          MeshEdgebreakerTraversalEncoder::EncodeAttributeSeam
                    (&this->traversal_encoder_,uVar2,is_seam);
          uVar2 = uVar2 + 1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::EncodeAttributeConnectivitiesOnFace(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  const FaceIndex src_face_id = corner_table_->Face(corner);
  visited_faces_[src_face_id.value()] = true;
  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      continue;  // Don't encode attribute seams on boundary edges.
    }
    const FaceIndex opp_face_id = corner_table_->Face(opp_corner);
    // Don't encode edges when the opposite face has been already processed.
    if (visited_faces_[opp_face_id.value()]) {
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      if (attribute_data_[i].connectivity_data.IsCornerOppositeToSeamEdge(
              corners[c])) {
        traversal_encoder_.EncodeAttributeSeam(i, true);
      } else {
        traversal_encoder_.EncodeAttributeSeam(i, false);
      }
    }
  }
  return true;
}